

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::logComment(TestContext *testCtx,char *comment)

{
  TestLog *this;
  MessageBuilder *pMVar1;
  MessageBuilder local_198;
  char *local_18;
  char *comment_local;
  TestContext *testCtx_local;
  
  local_18 = comment;
  comment_local = (char *)testCtx;
  this = tcu::TestContext::getLog(testCtx);
  tcu::TestLog::operator<<(&local_198,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [4])0x2bf72b7);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

static void logComment (tcu::TestContext& testCtx, const char* comment)
{
	testCtx.getLog() << TestLog::Message << "// " << comment << TestLog::EndMessage;
}